

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O1

void * mpp_enc_async_thread(void *data)

{
  int *piVar1;
  RK_S32 *pRVar2;
  RK_U32 *pRVar3;
  byte *pbVar4;
  HalEncTask *task;
  EncRcTask *pEVar5;
  MppEncImpl *enc;
  pthread_mutex_t *ppVar6;
  MppFrame s;
  MppEncRefFrmUsrCfg *pMVar7;
  MppPacket pvVar8;
  MppPskipMode MVar9;
  Mpp *pMVar10;
  MppEncHal pvVar11;
  pthread_mutex_t *ppVar12;
  bool bVar13;
  MppEncRefMode MVar14;
  RK_S32 RVar15;
  RK_S32 RVar16;
  RK_S32 RVar17;
  RK_S32 RVar18;
  EncAsyncWait EVar19;
  MppThread *pMVar20;
  MppThreadStatus MVar21;
  MPP_RET MVar22;
  RK_S32 RVar23;
  RK_U32 RVar24;
  EncAsyncTaskInfo *pEVar25;
  EncAsyncTaskInfo *pEVar26;
  MppBuffer pvVar27;
  void *pvVar28;
  size_t sVar29;
  MppStopwatch pvVar30;
  MppMeta pvVar31;
  RK_S64 RVar32;
  uint uVar33;
  char *pcVar34;
  char *fmt;
  uint uVar35;
  undefined8 uVar36;
  mpp_list *frm_in;
  ulong uVar37;
  mpp_list *pkt_out;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  MppFrame frm;
  EncAsyncWait wait;
  MppPacket packet;
  MppEncHal in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  MppPskipMode local_c0;
  EncAsyncWait local_b4;
  MppPacket local_b0;
  Mpp *local_a8;
  EncAsyncTaskInfo *local_a0;
  MppFrame local_98;
  MppEncHal local_90;
  MppThread *local_88;
  pthread_mutex_t *local_80;
  HalTaskHnd *local_78;
  EncRcTask *local_70;
  pthread_mutex_t *local_68;
  MppEncRefFrmUsrCfg *local_60;
  sem_t *local_58;
  sem_t *local_50;
  sem_t *local_48;
  pthread_cond_t *local_40;
  void *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  local_88 = enc->thread_enc;
  local_38 = data;
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread start\n","mpp_enc_async_thread");
  }
  pMVar20 = local_88;
  local_b4.val = 0;
  local_80 = (pthread_mutex_t *)local_88->mMutexCond;
  pthread_mutex_lock(local_80);
  MVar21 = MppThread::get_status(pMVar20,THREAD_WORK);
  bVar39 = MVar21 == MPP_THREAD_RUNNING;
  if (bVar39) {
    local_40 = (pthread_cond_t *)&local_88->mMutexCond[0].mCondition;
    local_48 = (sem_t *)&enc->cmd_start;
    local_50 = (sem_t *)&enc->cmd_done;
    local_68 = (pthread_mutex_t *)(local_88->mMutexCond + 3);
    local_58 = (sem_t *)&enc->enc_reset;
    local_78 = &enc->hnd;
    local_60 = &enc->frm_cfg;
    do {
      EVar19 = local_b4;
      uVar35 = enc->notify_flag;
      RVar24 = 0;
      bVar13 = true;
      if (enc->reset_flag == 0) {
        if ((uVar35 & 0x10) != 0) {
          RVar24 = uVar35 & 0xffffffef;
          goto LAB_0014143f;
        }
        bVar40 = (local_b4.val & uVar35) != 0;
        bVar13 = bVar40 || local_b4.val == 0;
        pcVar34 = "wait";
        if (bVar40 || local_b4.val == 0) {
          pcVar34 = "work";
        }
      }
      else {
LAB_0014143f:
        pcVar34 = "work";
      }
      if (((byte)mpp_enc_debug & 0x10) != 0) {
        in_stack_ffffffffffffff20 =
             CONCAT44((int)(in_stack_ffffffffffffff20 >> 0x20),~local_b4.val & enc->status_flag);
        in_stack_ffffffffffffff18 =
             (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),local_b4.val);
        _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_async_wait",
                   enc,(ulong)enc->status_flag,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                   uVar35,pcVar34);
      }
      enc->status_flag = (RK_U32)EVar19;
      enc->notify_flag = RVar24;
      if (bVar13) {
        enc->work_count = enc->work_count + 1;
      }
      else {
        enc->wait_count = enc->wait_count + 1;
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","wait start\n","mpp_enc_async_thread");
        }
        pMVar20 = local_88;
        MVar21 = local_88->mStatus[0];
        local_88->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_40,local_80);
        if (pMVar20->mStatus[0] == MPP_THREAD_WAITING) {
          local_88->mStatus[0] = MVar21;
        }
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","wait done\n","mpp_enc_async_thread");
        }
      }
      pthread_mutex_unlock(local_80);
      if (!bVar39) goto LAB_00142e7c;
      if ((enc->cmd_send == enc->cmd_recv) && (enc->reset_flag == 0)) {
        pvVar28 = enc->mpp;
        pEVar25 = enc->async;
        local_b0 = (MppPacket)0x0;
        local_98 = (MppFrame)0x0;
        if (enc->hnd == (HalTaskHnd)0x0) {
          hal_task_get_hnd(enc->tasks,0,local_78);
          if (enc->hnd != (HalTaskHnd)0x0) {
            local_b4.val = local_b4.val & 0xffffffef;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","get hnd success\n","try_get_async_task");
            }
            if (enc->async != (EncAsyncTaskInfo *)0x0) {
              in_stack_ffffffffffffff18 =
                   (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb6c);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "enc->async == __null","try_get_async_task",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
            }
            pEVar25 = (EncAsyncTaskInfo *)hal_task_hnd_get_data(enc->hnd);
            memset(pEVar25,0,0x238);
            (pEVar25->task).rc_task = &pEVar25->rc;
            (pEVar25->task).frm_cfg = &pEVar25->usr;
            (pEVar25->usr).force_flag = 0;
            enc->async = pEVar25;
            goto LAB_001417f6;
          }
          local_b4.val = local_b4.val | 0x10;
          uVar37 = 0xffffffff;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","get hnd failed\n","try_get_async_task");
          }
        }
        else {
LAB_001417f6:
          if (*local_78 == (HalTaskHnd)0x0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb77);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->hnd",
                       "try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
          }
          if (enc->async == (EncAsyncTaskInfo *)0x0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb78);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                       "try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
          }
          local_b0 = (pEVar25->task).packet;
          local_98 = (pEVar25->task).frame;
          if (local_98 == (MppFrame)0x0) {
            ppVar6 = *(pthread_mutex_t **)((long)pvVar28 + 0x10);
            if (ppVar6 != (pthread_mutex_t *)0x0) {
              pthread_mutex_lock(ppVar6);
              RVar23 = mpp_list::list_size((mpp_list *)&ppVar6->__data);
              if (RVar23 != 0) {
                mpp_list::del_at_head((mpp_list *)&ppVar6->__data,&local_98,8);
                pthread_cond_signal((pthread_cond_t *)(ppVar6 + 1));
                piVar1 = (int *)((long)pvVar28 + 0x2c);
                *piVar1 = *piVar1 + 1;
                if (local_98 == (MppFrame)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb8a);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                             "try_get_async_task",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 2;
                local_b4.val = local_b4.val & 0xfffffffe;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","get input frame success\n","try_get_async_task");
                }
                pvVar30 = mpp_frame_get_stopwatch(local_98);
                mpp_stopwatch_record(pvVar30,"encode task start");
                (pEVar25->task).frame = local_98;
              }
              pthread_mutex_unlock(ppVar6);
            }
            if (local_98 == (MppFrame)0x0) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","get input frame failed\n","try_get_async_task");
              }
              local_b4.val = local_b4.val | 1;
              uVar37 = 0xffffffff;
              goto LAB_001424dd;
            }
          }
          if (local_b0 == (MppPacket)0x0) {
            RVar23 = mpp_frame_has_meta(local_98);
            if (RVar23 != 0) {
              pvVar31 = mpp_frame_get_meta(local_98);
              mpp_meta_get_packet(pvVar31,KEY_OUTPUT_PACKET,&local_b0);
            }
            if (local_b0 != (MppPacket)0x0) {
              *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 4;
              local_b4.val = local_b4.val & 0xfffffff7;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","get output packet success\n","try_get_async_task");
              }
              (pEVar25->task).packet = local_b0;
            }
          }
          if (local_98 == (MppFrame)0x0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbb0);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                       "try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
          }
          pEVar5 = &pEVar25->rc;
          pEVar26 = (EncAsyncTaskInfo *)mpp_frame_get_stopwatch(local_98);
          local_a0 = pEVar26;
          local_70 = pEVar5;
          if (((uint)pEVar25->status & 8) == 0) {
            RVar24 = enc->task_idx;
            enc->task_idx = RVar24 + 1;
            pEVar25->seq_idx = RVar24;
            RVar32 = mpp_frame_get_pts((pEVar25->task).frame);
            pEVar25->pts = RVar32;
            (pEVar25->task).stopwatch = pEVar26;
            (pEVar25->rc).frame = (pEVar25->task).frame;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_async_task",0);
            }
            local_c0 = (MppPskipMode)(pEVar25->task).packet;
            s = (pEVar25->task).frame;
            (pEVar25->task).input = (MppBuffer)0x0;
            (pEVar25->task).output = (MppBuffer)0x0;
            if (local_c0 == (MppPskipMode)0x0) {
              mpp_packet_new((MppPacket *)&local_c0);
              (pEVar25->task).packet = (MppPacket)local_c0;
            }
            else {
              pvVar27 = mpp_packet_get_buffer((MppPacket)local_c0);
              (pEVar25->task).output = pvVar27;
            }
            if (s != (MppFrame)0x0) {
              RVar32 = mpp_frame_get_pts(s);
              pvVar27 = mpp_frame_get_buffer(s);
              (pEVar25->task).input = pvVar27;
              mpp_packet_set_pts((MppPacket)local_c0,RVar32);
              MVar9 = local_c0;
              RVar32 = mpp_frame_get_dts(s);
              mpp_packet_set_dts((MppPacket)MVar9,RVar32);
              RVar24 = mpp_frame_get_eos(s);
              if (RVar24 == 0) {
                mpp_packet_clr_eos((MppPacket)local_c0);
              }
              else {
                mpp_packet_set_eos((MppPacket)local_c0);
              }
              pEVar26 = local_a0;
              if ((pEVar25->task).input != (MppBuffer)0x0) {
                *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 8;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_async_task");
                }
                goto LAB_00141c69;
              }
            }
            mpp_stopwatch_record(pEVar26,"empty frame on check frm pkt");
            (pEVar25->task).valid = 1;
            (pEVar25->task).length = 0;
            (pEVar25->task).flags.drop_by_fps = 1;
            uVar38 = 0;
            uVar37 = 0;
          }
          else {
LAB_00141c69:
            uVar35 = pEVar25->seq_idx;
            uVar37 = 0;
            if (((uint)pEVar25->status & 0x20) == 0) {
              MVar22 = rc_frm_check_drop(enc->rc_ctx,pEVar5);
              if (MVar22 == MPP_OK) {
                *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 0x20;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_async_task",(ulong)uVar35,
                             (ulong)(*(uint *)((long)&(pEVar25->rc).frm + 4) & 1));
                }
                (pEVar25->task).valid = 1;
                if (((pEVar25->rc).frm.val & 0x100000000) == 0) {
                  pMVar7 = (pEVar25->task).frm_cfg;
                  RVar24 = local_60->force_flag;
                  RVar16 = local_60->force_idr;
                  RVar17 = local_60->force_pskip;
                  RVar18 = local_60->force_nonref;
                  RVar23 = local_60->force_temporal_id;
                  MVar14 = local_60->force_ref_mode;
                  RVar15 = local_60->force_ref_arg;
                  pMVar7->force_lt_idx = local_60->force_lt_idx;
                  pMVar7->force_temporal_id = RVar23;
                  pMVar7->force_ref_mode = MVar14;
                  pMVar7->force_ref_arg = RVar15;
                  pMVar7->force_flag = RVar24;
                  pMVar7->force_idr = RVar16;
                  pMVar7->force_pskip = RVar17;
                  pMVar7->force_nonref = RVar18;
                  local_60->force_flag = 0;
                  bVar39 = true;
                  uVar37 = 0;
                }
                else {
                  mpp_stopwatch_record(local_a0,"invalid on frame rate drop");
                  (pEVar25->task).length = 0;
                  (pEVar25->task).flags.drop_by_fps = 1;
                  uVar37 = 0;
                  bVar39 = false;
                }
              }
              else {
                uVar37 = (ulong)(uint)MVar22;
                in_stack_ffffffffffffff18 =
                     (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                bVar39 = false;
                _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_drop:%-4d failed return %d",(char *)0x0,
                           enc->mpp,0xbd4,in_stack_ffffffffffffff18);
              }
              uVar38 = (ulong)uVar35;
              if (!bVar39) goto LAB_001422f3;
            }
            uVar38 = (ulong)uVar35;
            local_a0 = (EncAsyncTaskInfo *)&pEVar25->task;
            if (((HalEncTask *)local_a0)->valid == 0) {
              in_stack_ffffffffffffff18 =
                   (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbe7);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->valid",
                         "try_get_async_task",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
            }
            if (((uint)pEVar25->status & 0x80) == 0) {
              local_a8 = (Mpp *)CONCAT44(local_a8._4_4_,(int)uVar37);
              pvVar27 = (pEVar25->task).output;
              if (pvVar27 == (MppBuffer)0x0) {
                local_90 = (MppEncHal)CONCAT44(local_90._4_4_,uVar35);
                uVar33 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                         ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
                uVar35 = uVar33 * 3 >> 1;
                if (enc->coding != MPP_VIDEO_CodingMJPEG) {
                  uVar35 = uVar33;
                }
                pvVar28 = enc->mpp;
                pvVar8 = (pEVar25->task).packet;
                local_c0.pskip_is_ref = 0;
                local_c0.pskip_is_non_ref = 0;
                if (uVar35 == 0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb41);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                             "check_async_pkt_buf",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                mpp_buffer_get_with_tag
                          (*(MppBufferGroup *)((long)pvVar28 + 0x38),(MppBuffer *)&local_c0,
                           (ulong)uVar35,"mpp_enc","check_async_pkt_buf");
                mpp_buffer_attach_dev_f("check_async_pkt_buf",(MppBuffer)local_c0,enc->dev);
                if (local_c0 == (MppPskipMode)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb44);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                             "check_async_pkt_buf",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                enc->pkt_buf = (MppBuffer)local_c0;
                pvVar28 = mpp_buffer_get_ptr_with_caller((MppBuffer)local_c0,"check_async_pkt_buf");
                *(void **)((long)pvVar8 + 8) = pvVar28;
                *(void **)((long)pvVar8 + 0x10) = pvVar28;
                sVar29 = mpp_buffer_get_size_with_caller((MppBuffer)local_c0,"check_async_pkt_buf");
                *(size_t *)((long)pvVar8 + 0x18) = sVar29;
                *(undefined8 *)((long)pvVar8 + 0x20) = 0;
                *(MppPskipMode *)((long)pvVar8 + 0x40) = local_c0;
                (pEVar25->task).output = (MppBuffer)local_c0;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","create output pkt %p buf %p\n","check_async_pkt_buf",
                             (pEVar25->task).packet);
                }
                uVar38 = (ulong)local_90 & 0xffffffff;
              }
              else if (((byte)mpp_enc_debug & 0x20) != 0) {
                pvVar8 = (pEVar25->task).packet;
                local_90 = mpp_packet_get_pos(pvVar8);
                in_stack_ffffffffffffff20 = mpp_packet_get_length((pEVar25->task).packet);
                in_stack_ffffffffffffff18 = local_90;
                _mpp_log_l(4,"mpp_enc","output to pkt %p buf %p pos %p length %d\n",
                           "check_async_pkt_buf",pvVar8,pvVar27,local_90,in_stack_ffffffffffffff20);
              }
              *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 0x80;
              uVar37 = (ulong)local_a8 & 0xffffffff;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d check pkt buffer success\n","try_get_async_task",
                           uVar38);
              }
            }
            if ((pEVar25->task).packet == (MppPacket)0x0) {
              in_stack_ffffffffffffff18 =
                   (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbf0);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->packet"
                         ,"try_get_async_task",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
            }
            if ((pEVar25->task).output == (MppBuffer)0x0) {
              in_stack_ffffffffffffff18 =
                   (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbf1);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->output"
                         ,"try_get_async_task",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
            }
            if (enc->hal_info_updated == 0) {
              update_enc_hal_info(enc);
              enc->hal_info_updated = 1;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d update enc hal info success\n","try_get_async_task",
                           uVar38);
              }
            }
            if (((uint)enc->hdr_status & 1) == 0) {
              enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
              sVar29 = mpp_packet_get_length(enc->hdr_pkt);
              enc->hdr_len = (RK_U32)sVar29;
              *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_async_task",
                           uVar38,sVar29 & 0xffffffff);
              }
              mpp_packet_append((pEVar25->task).packet,enc->hdr_pkt);
              RVar24 = enc->hdr_len;
              (pEVar25->task).header_length = RVar24;
              pRVar3 = &(pEVar25->task).length;
              *pRVar3 = *pRVar3 + RVar24;
              *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
            }
            check_hal_task_pkt_len((HalEncTask *)local_a0,"gen_hdr and adding");
            if (((pEVar25->status).val & 0x100) == 0) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_async_task",uVar38);
              }
              MVar22 = enc_impl_start(enc->impl,(HalEncTask *)local_a0);
              if (MVar22 != MPP_OK) {
                uVar37 = (ulong)(uint)MVar22;
                in_stack_ffffffffffffff18 =
                     (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_start:%-4d failed return %d",(char *)0x0,
                           enc->mpp,0xc10,in_stack_ffffffffffffff18);
                goto LAB_001422f3;
              }
              pbVar4 = (byte *)((long)&pEVar25->status + 1);
              *pbVar4 = *pbVar4 | 1;
              uVar37 = 0;
            }
            if (((pEVar25->status).val & 0x200) == 0) {
              if ((pEVar25->usr).force_flag != 0) {
                mpp_enc_refs_set_usr_cfg(enc->refs,&pEVar25->usr);
                (pEVar25->usr).force_flag = 0;
              }
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d refs force update success\n","try_get_async_task",
                           uVar38);
              }
              pbVar4 = (byte *)((long)&pEVar25->status + 1);
              *pbVar4 = *pbVar4 | 2;
            }
            if (((pEVar25->status).val & 0x800) == 0) {
              mpp_enc_refs_stash(enc->refs);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d refs stash success\n","try_get_async_task",uVar38);
              }
              pbVar4 = (byte *)((long)&pEVar25->status + 1);
              *pbVar4 = *pbVar4 | 8;
            }
          }
LAB_001422f3:
          if ((int)uVar37 != 0) {
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d terminate\n","try_get_async_task",uVar38);
            }
            pvVar28 = enc->mpp;
            mpp_stopwatch_record((pEVar25->task).stopwatch,"encode task done");
            MVar9 = (MppPskipMode)(pEVar25->task).packet;
            if (MVar9 != (MppPskipMode)0x0) {
              local_a8 = (Mpp *)CONCAT44(local_a8._4_4_,(int)uVar37);
              local_c0 = MVar9;
              mpp_packet_set_length((MppPacket)MVar9,(ulong)(pEVar25->task).length);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","async_task_terminate",
                           (ulong)*(ushort *)((long)&(pEVar25->rc).frm + 6),enc->task_pts);
              }
              ppVar6 = *(pthread_mutex_t **)((long)pvVar28 + 8);
              if (ppVar6 != (pthread_mutex_t *)0x0) {
                if (enc->frame != (MppFrame)0x0) {
                  pvVar31 = mpp_packet_get_meta((MppPacket)local_c0);
                  pvVar30 = mpp_frame_get_stopwatch(enc->frame);
                  mpp_stopwatch_record(pvVar30,"encode task terminate");
                  mpp_meta_set_frame(pvVar31,KEY_INPUT_FRAME,enc->frame);
                  enc->frame = (MppFrame)0x0;
                }
                pthread_mutex_lock(ppVar6);
                mpp_list::add_at_tail((mpp_list *)&ppVar6->__data,&local_c0,8);
                piVar1 = (int *)((long)pvVar28 + 0x20);
                *piVar1 = *piVar1 + 1;
                pthread_cond_signal((pthread_cond_t *)(ppVar6 + 1));
                if (local_c0 == (MppPskipMode)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xace);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                             "async_task_terminate",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","packet out ready\n","async_task_terminate");
                }
                pthread_mutex_unlock(ppVar6);
              }
              uVar37 = (ulong)local_a8 & 0xffffffff;
            }
            memset(pEVar25,0,0x238);
            (pEVar25->task).rc_task = local_70;
            (pEVar25->task).frm_cfg = &pEVar25->usr;
            (pEVar25->usr).force_flag = 0;
          }
        }
LAB_001424dd:
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","try_get_async_task ret %d\n","mpp_enc_async_thread",uVar37);
        }
        if ((int)uVar37 == 0) {
          if (enc->async == (EncAsyncTaskInfo *)0x0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xd6f);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                       "mpp_enc_async_thread",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
          }
          if ((enc->async->task).valid == 0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xd70);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "enc->async->task.valid","mpp_enc_async_thread",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
          }
          pMVar10 = (Mpp *)enc->mpp;
          local_70 = (EncRcTask *)enc->impl;
          pvVar11 = enc->enc_hal;
          pEVar25 = enc->async;
          pEVar26 = *(EncAsyncTaskInfo **)&(pEVar25->task).rc_task;
          uVar35 = pEVar25->seq_idx;
          if ((pEVar25->task).valid == 0) {
            in_stack_ffffffffffffff18 =
                 (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xc54);
            local_a0 = pEVar25;
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->valid",
                       "proc_async_task",in_stack_ffffffffffffff18);
            pEVar25 = local_a0;
            if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00142ed1:
              abort();
            }
          }
          uVar37 = 0;
          if ((pEVar25->task).flags.drop_by_fps == 0) {
            local_a8 = pMVar10;
            local_90 = pvVar11;
            if (((uint)pEVar25->status & 0x40) == 0) {
              *(byte *)&pEVar25->status = *(byte *)&pEVar25->status | 0x40;
              local_a0 = pEVar26;
              mpp_enc_get_pskip_mode((Mpp *)enc->mpp,pEVar25,&local_c0);
              bVar39 = true;
              uVar37 = 0;
              if (local_c0.pskip_is_non_ref != 0 || local_c0.pskip_is_ref != 0) {
                MVar22 = mpp_enc_force_pskip((Mpp *)enc->mpp,pEVar25);
                if (MVar22 == MPP_OK) {
                  uVar37 = 0;
                  bVar39 = false;
                }
                else {
                  uVar37 = (ulong)(uint)MVar22;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","proc_async_task",
                               (ulong)*(ushort *)&(local_a0->task).field_0x8e);
                  }
                }
              }
              pEVar26 = local_a0;
              if (!bVar39) goto LAB_00142658;
            }
            pEVar5 = local_70;
            if (((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) &&
               (RVar23 = mpp_enc_refs_next_frm_is_intra(enc->refs), RVar23 != 0)) {
              do {
                MVar22 = try_proc_processing_task(enc,&local_b4);
              } while (MVar22 == MPP_OK);
              MVar22 = mpp_enc_proc_two_pass(local_a8,pEVar25);
              if (MVar22 != MPP_OK) goto LAB_00142e4f;
            }
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","proc_async_task",(ulong)uVar35);
            }
            mpp_enc_refs_get_cpb(enc->refs,(EncCpbStatus *)pEVar26);
            if ((mpp_enc_debug._2_1_ & 1) != 0) {
              _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                         "proc_async_task",(ulong)uVar35);
            }
            task = &pEVar25->task;
            MVar22 = enc_impl_proc_dpb(pEVar5,task);
            if (MVar22 == MPP_OK) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","proc_async_task",
                           (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
              }
              MVar22 = rc_frm_start(enc->rc_ctx,(EncRcTask *)pEVar26);
              if (MVar22 == MPP_OK) {
                mpp_enc_add_sw_header(enc,task);
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","proc_async_task",
                             (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
                }
                MVar22 = enc_impl_proc_hal(pEVar5,task);
                if (MVar22 == MPP_OK) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal get task\n","proc_async_task",
                               (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
                  }
                  MVar22 = mpp_enc_hal_get_task(local_90,task);
                  if (MVar22 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","proc_async_task",
                                 (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
                    }
                    MVar22 = rc_hal_start(enc->rc_ctx,(EncRcTask *)pEVar26);
                    if (MVar22 == MPP_OK) {
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","proc_async_task",
                                   (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
                      }
                      MVar22 = mpp_enc_hal_gen_regs(local_90,task);
                      if (MVar22 == MPP_OK) {
                        mpp_stopwatch_record((pEVar25->task).stopwatch,"encode hal start");
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","proc_async_task",
                                     (ulong)*(ushort *)&(pEVar26->task).field_0x8e);
                        }
                        MVar22 = mpp_enc_hal_start(local_90,task);
                        uVar37 = 0;
                        if (MVar22 == MPP_OK) goto LAB_00142658;
                        in_stack_ffffffffffffff18 =
                             (MppEncHal)
                             CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                        pcVar34 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                        uVar36 = 0xc8e;
                      }
                      else {
                        in_stack_ffffffffffffff18 =
                             (MppEncHal)
                             CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                        pcVar34 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                        uVar36 = 0xc8a;
                      }
                    }
                    else {
                      in_stack_ffffffffffffff18 =
                           (MppEncHal)
                           CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                      pcVar34 = "mpp %p rc_hal_start:%-4d failed return %d";
                      uVar36 = 0xc87;
                    }
                  }
                  else {
                    in_stack_ffffffffffffff18 =
                         (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22)
                    ;
                    pcVar34 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                    uVar36 = 0xc84;
                  }
                }
                else {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                  pcVar34 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                  uVar36 = 0xc81;
                }
              }
              else {
                in_stack_ffffffffffffff18 =
                     (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
                pcVar34 = "mpp %p rc_frm_start:%-4d failed return %d";
                uVar36 = 0xc7b;
              }
            }
            else {
              in_stack_ffffffffffffff18 =
                   (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar22);
              pcVar34 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
              uVar36 = 0xc78;
            }
            _mpp_log_l(2,"mpp_enc",pcVar34,(char *)0x0,local_a8,uVar36,in_stack_ffffffffffffff18);
          }
          else {
LAB_00142658:
            pbVar4 = (byte *)((long)&pEVar25->status + 3);
            *pbVar4 = *pbVar4 & 0xf7;
            hal_task_hnd_set_status(*local_78,1);
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d on processing ret %d\n","proc_async_task",
                         (ulong)*(ushort *)&(pEVar26->task).field_0x8e,uVar37);
            }
            *local_78 = (HalTaskHnd)0x0;
            local_78[1] = (EncAsyncTaskInfo *)0x0;
          }
          (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
        }
        else {
          try_proc_processing_task(enc,&local_b4);
        }
      }
      else {
        ppVar6 = *(pthread_mutex_t **)((long)local_38 + 0x10);
        pthread_mutex_lock(ppVar6);
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_async_thread",
                     (ulong)enc->cmd_recv,(ulong)enc->cmd);
        }
        do {
          MVar22 = try_proc_processing_task(enc,&local_b4);
        } while (MVar22 == MPP_OK);
        if (enc->cmd_send == enc->cmd_recv) {
          if (enc->reset_flag != 0) {
            if (((byte)mpp_enc_debug & 0x20) == 0) goto LAB_00142b23;
            fmt = "thread reset start\n";
            pcVar34 = "mpp_enc_async_thread";
            do {
              _mpp_log_l(4,"mpp_enc",fmt,pcVar34);
LAB_00142b23:
              do {
                RVar23 = mpp_list::list_size((mpp_list *)&ppVar6->__data);
                ppVar12 = local_80;
                if (RVar23 == 0) {
                  pthread_mutex_lock(local_80);
                  enc->status_flag = 0;
                  pthread_mutex_unlock(ppVar12);
                  *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
                  pRVar2 = &(enc->frm_cfg).force_idr;
                  *pRVar2 = *pRVar2 + 1;
                  pthread_mutex_lock(local_68);
                  enc->reset_flag = 0;
                  sem_post(local_58);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_async_thread");
                  }
                  pthread_mutex_unlock(local_68);
                  goto LAB_00142e3f;
                }
                pvVar28 = enc->mpp;
                local_c0.pskip_is_ref = 0;
                local_c0.pskip_is_non_ref = 0;
                local_b0 = (MppPacket)0x0;
                mpp_list::del_at_head(*(mpp_list **)((long)pvVar28 + 0x10),&local_c0,8);
                *(int *)((long)pvVar28 + 0x2c) = *(int *)((long)pvVar28 + 0x2c) + 1;
                if (local_c0 == (MppPskipMode)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xae2);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frm",
                             "async_task_skip",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","skip input frame start\n","async_task_skip");
                }
                pvVar30 = mpp_frame_get_stopwatch((MppFrame)local_c0);
                mpp_stopwatch_record(pvVar30,"skip task start");
                RVar23 = mpp_frame_has_meta((MppFrame)local_c0);
                if ((RVar23 != 0) &&
                   (pvVar31 = mpp_frame_get_meta((MppFrame)local_c0), pvVar31 != (MppMeta)0x0)) {
                  mpp_meta_get_packet(pvVar31,KEY_OUTPUT_PACKET,&local_b0);
                }
                if (local_b0 == (MppPacket)0x0) {
                  mpp_packet_new(&local_b0);
                }
                if (local_b0 == (MppPacket)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xaf2);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                             "async_task_skip",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                mpp_packet_set_length(local_b0,0);
                pvVar8 = local_b0;
                RVar32 = mpp_frame_get_pts((MppFrame)local_c0);
                mpp_packet_set_pts(pvVar8,RVar32);
                pvVar8 = local_b0;
                RVar32 = mpp_frame_get_dts((MppFrame)local_c0);
                mpp_packet_set_dts(pvVar8,RVar32);
                RVar24 = mpp_frame_get_eos((MppFrame)local_c0);
                if (RVar24 == 0) {
                  mpp_packet_clr_eos(local_b0);
                }
                else {
                  mpp_packet_set_eos(local_b0);
                }
                pvVar31 = mpp_packet_get_meta(local_b0);
                if (pvVar31 == (MppMeta)0x0) {
                  in_stack_ffffffffffffff18 =
                       (MppEncHal)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xafe);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"meta",
                             "async_task_skip",in_stack_ffffffffffffff18);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142ed1;
                }
                mpp_meta_set_frame(pvVar31,KEY_INPUT_FRAME,(MppFrame)local_c0);
                ppVar12 = *(pthread_mutex_t **)((long)pvVar28 + 8);
                if (ppVar12 != (pthread_mutex_t *)0x0) {
                  pthread_mutex_lock(ppVar12);
                  mpp_stopwatch_record(pvVar30,"skip task output");
                  mpp_list::add_at_tail((mpp_list *)&ppVar12->__data,&local_b0,8);
                  *(int *)((long)pvVar28 + 0x20) = *(int *)((long)pvVar28 + 0x20) + 1;
                  pthread_cond_signal((pthread_cond_t *)(ppVar12 + 1));
                  pthread_mutex_unlock(ppVar12);
                }
              } while (((byte)mpp_enc_debug & 0x20) == 0);
              fmt = "packet skip ready\n";
              pcVar34 = "async_task_skip";
            } while( true );
          }
        }
        else {
          sem_wait(local_48);
          MVar22 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
          if (MVar22 != MPP_OK) {
            *enc->cmd_ret = MVar22;
          }
          uVar35 = enc->cmd_recv + 1;
          enc->cmd_recv = uVar35;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_async_thread",
                       (ulong)uVar35,(ulong)enc->cmd_send);
          }
          enc->param = (void *)0x0;
          enc->cmd = 0;
          sem_post(local_50);
          mpp_enc_hal_prepare(enc->enc_hal);
          mpp_enc_proc_rc_update(enc);
        }
LAB_00142e3f:
        pthread_mutex_unlock(ppVar6);
        local_b4.val = 0;
      }
LAB_00142e4f:
      pthread_mutex_lock(local_80);
      MVar21 = MppThread::get_status(local_88,THREAD_WORK);
      bVar39 = MVar21 == MPP_THREAD_RUNNING;
    } while (bVar39);
  }
  pthread_mutex_unlock(local_80);
LAB_00142e7c:
  do {
    MVar22 = try_proc_processing_task(enc,&local_b4);
  } while (MVar22 == MPP_OK);
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread finish\n","mpp_enc_async_thread");
  }
  return (void *)0x0;
}

Assistant:

void *mpp_enc_async_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc = enc->thread_enc;
    EncAsyncWait wait;
    MPP_RET ret = MPP_OK;

    enc_dbg_func("thread start\n");

    wait.val = 0;

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_async_wait(enc, &wait)) {
                enc_dbg_detail("wait start\n");
                thd_enc->wait();
                enc_dbg_detail("wait done\n");
            }
        }

        // When encoder is not on encoding process external config and reset
        // 1. process user control and reset flag
        if (enc->cmd_send != enc->cmd_recv || enc->reset_flag) {
            mpp_list *frm_in = mpp->mFrmIn;

            /* when process cmd or reset hold frame input */
            frm_in->lock();

            enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);

            // wait all tasks done
            while (MPP_OK == try_proc_processing_task(enc, &wait));

            if (enc->cmd_send != enc->cmd_recv) {
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                goto SYNC_DONE;
            }

            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");

                /* skip the frames in input queue */
                while (frm_in->list_size())
                    async_task_skip(enc);

                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
            }
        SYNC_DONE:
            frm_in->unlock();
            wait.val = 0;
            continue;
        }

        // 2. try get a task to encode
        ret = try_get_async_task(enc, &wait);
        enc_dbg_detail("try_get_async_task ret %d\n", ret);
        if (ret) {
            try_proc_processing_task(enc, &wait);
            continue;
        }

        mpp_assert(enc->async);
        mpp_assert(enc->async->task.valid);

        proc_async_task(enc, &wait);
    }
    /* wait all task done */
    while (MPP_OK == try_proc_processing_task(enc, &wait));

    enc_dbg_func("thread finish\n");

    return NULL;
}